

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  element_type *peVar1;
  pointer psVar2;
  pointer psVar3;
  bool bVar4;
  shared_ptr<Body> *body;
  pointer body_00;
  shared_ptr<Body> *body_01;
  shared_ptr<Body> *psVar5;
  double dVar6;
  shared_ptr<Quad> quad;
  vector<std::shared_ptr<Body>,_std::allocator<std::shared_ptr<Body>_>_> bodies;
  shared_ptr<BHTree> tree;
  double radius;
  shared_ptr<Body> sStack_98;
  vector<std::shared_ptr<Body>,_std::allocator<std::shared_ptr<Body>_>_> local_88;
  shared_ptr<Quad> local_70;
  double local_60;
  double local_58;
  undefined8 local_50;
  double local_48;
  double local_40 [2];
  
  local_40[1] = 250000000000.0;
  local_88.super__Vector_base<std::shared_ptr<Body>,_std::allocator<std::shared_ptr<Body>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_70.super___shared_ptr<Quad,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_60 = 0.0;
  local_40[0] = 0.0;
  local_48 = 0.0;
  local_88.super__Vector_base<std::shared_ptr<Body>,_std::allocator<std::shared_ptr<Body>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (shared_ptr<Body> *)0x0;
  local_88.super__Vector_base<std::shared_ptr<Body>,_std::allocator<std::shared_ptr<Body>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (shared_ptr<Body> *)0x0;
  local_50 = 0x4896d52549f0497b;
  std::make_shared<Body,double,double,double,double,double>
            ((double *)&sStack_98,(double *)&local_70,&local_60,local_40,&local_48);
  std::vector<std::shared_ptr<Body>,std::allocator<std::shared_ptr<Body>>>::
  emplace_back<std::shared_ptr<Body>>
            ((vector<std::shared_ptr<Body>,std::allocator<std::shared_ptr<Body>>> *)&local_88,
             &sStack_98);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sStack_98.super___shared_ptr<Body,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_60 = 0.0;
  local_40[0] = 0.0;
  local_70.super___shared_ptr<Quad,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x422af637c6000000;
  local_48 = 23950000000.0;
  local_50 = 0x472fcc0ef79c813f;
  std::make_shared<Body,double,double,double,double,double>
            ((double *)&sStack_98,(double *)&local_70,&local_60,local_40,&local_48);
  std::vector<std::shared_ptr<Body>,std::allocator<std::shared_ptr<Body>>>::
  emplace_back<std::shared_ptr<Body>>
            ((vector<std::shared_ptr<Body>,std::allocator<std::shared_ptr<Body>>> *)&local_88,
             &sStack_98);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sStack_98.super___shared_ptr<Body,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  dVar6 = 0.0;
  while (dVar6 < 0.5) {
    local_70.super___shared_ptr<Quad,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         ((ulong)local_70.super___shared_ptr<Quad,_(__gnu_cxx::_Lock_policy)2>._M_ptr &
         0xffffffff00000000);
    local_60 = (double)((ulong)local_60 & 0xffffffff00000000);
    local_58 = dVar6;
    std::make_shared<Quad,int,int,double&>((int *)&sStack_98,(int *)&local_70,&local_60);
    std::make_shared<BHTree,std::shared_ptr<Quad>&>(&local_70);
    psVar2 = local_88.
             super__Vector_base<std::shared_ptr<Body>,_std::allocator<std::shared_ptr<Body>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (body_00 = local_88.
                   super__Vector_base<std::shared_ptr<Body>,_std::allocator<std::shared_ptr<Body>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        psVar3 = local_88.
                 super__Vector_base<std::shared_ptr<Body>,_std::allocator<std::shared_ptr<Body>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish,
        body_01 = local_88.
                  super__Vector_base<std::shared_ptr<Body>,_std::allocator<std::shared_ptr<Body>_>_>
                  ._M_impl.super__Vector_impl_data._M_start, body_00 != psVar2;
        body_00 = body_00 + 1) {
      bVar4 = Body::in((body_00->super___shared_ptr<Body,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                       (shared_ptr<Quad> *)&sStack_98);
      if (bVar4) {
        BHTree::insert((BHTree *)
                       local_70.super___shared_ptr<Quad,_(__gnu_cxx::_Lock_policy)2>._M_ptr,body_00)
        ;
      }
    }
    for (; psVar2 = local_88.
                    super__Vector_base<std::shared_ptr<Body>,_std::allocator<std::shared_ptr<Body>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish,
        psVar5 = local_88.
                 super__Vector_base<std::shared_ptr<Body>,_std::allocator<std::shared_ptr<Body>_>_>.
                 _M_impl.super__Vector_impl_data._M_start, body_01 != psVar3; body_01 = body_01 + 1)
    {
      Body::resetForce((body_01->super___shared_ptr<Body,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
      BHTree::updateForce((BHTree *)
                          local_70.super___shared_ptr<Quad,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                          body_01);
      Body::update((body_01->super___shared_ptr<Body,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,0.1);
    }
    for (; psVar5 != psVar2; psVar5 = psVar5 + 1) {
      peVar1 = (psVar5->super___shared_ptr<Body,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      printf("%10.3E %10.3E %10.3E %10.3E\n",peVar1->x,peVar1->y,peVar1->vx,peVar1->vy);
    }
    puts("======");
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_70.super___shared_ptr<Quad,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&sStack_98.super___shared_ptr<Body,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    dVar6 = local_58 + 0.1;
  }
  std::vector<std::shared_ptr<Body>,_std::allocator<std::shared_ptr<Body>_>_>::~vector(&local_88);
  return 0;
}

Assistant:

int main() {
    double dt = 0.1;
    double radius = 2.5E11;

    std::vector<std::shared_ptr<Body>> bodies;
    bodies.push_back(std::make_shared<Body>(0.0, 0.0, 0.0, 0.0, 4.97250E41));
    bodies.push_back(std::make_shared<Body>(5.790E10, 0.0, 0.0, 2.395E10, 8.25500E34));


    for (double t = 0; t < 0.5; t += dt) {
        std::shared_ptr<Quad> quad = std::make_shared<Quad>(0, 0, radius);
        std::shared_ptr<BHTree> tree = std::make_shared<BHTree>(quad);

        for (const auto &body : bodies) {
            if (body->in(quad)) {
                tree->insert(body);
            }
        }

        for (const auto &body : bodies) {
            body->resetForce();
            tree->updateForce(body);
            body->update(dt);
        }

        for (const auto &body : bodies) {
            printf("%10.3E %10.3E %10.3E %10.3E\n", body->x, body->y, body->vx, body->vy);
        }

        printf("======\n");
    }
    return 0;
}